

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

parser_token char_to_token(char c)

{
  ushort **ppuVar1;
  parser_token local_c;
  char c_local;
  
  if (c == '\n') {
    local_c = NEW_LINE;
  }
  else if (c == '\"') {
    local_c = QUOTE;
  }
  else if (c == '#') {
    local_c = COMMENT_START;
  }
  else if (c == '$') {
    local_c = VARIABLE_START;
  }
  else if (c == '=') {
    local_c = EQUAL;
  }
  else if (c == '[') {
    local_c = ARRAY_START;
  }
  else if (c == ']') {
    local_c = ARRAY_END;
  }
  else {
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)c] & 0x800) == 0) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)c] & 0x400) == 0) {
        local_c = UNKNOWN;
      }
      else {
        local_c = ALPHA_CHAR;
      }
    }
    else {
      local_c = NUMERIC_CHAR;
    }
  }
  return local_c;
}

Assistant:

enum parser_token char_to_token(char c)
{
        switch (c) {
        case '[':
                return ARRAY_START;
        case ']':
                return ARRAY_END;
        case '#':
                return COMMENT_START;
        case '=':
                return EQUAL;
        case '\n':
                return NEW_LINE;
        case '"':
                return QUOTE;
        case '$':
                return VARIABLE_START;
        default:
                if (isdigit(c)) {
                        return NUMERIC_CHAR;
                }

                if (isalpha(c)) {
                        return ALPHA_CHAR;
                }

                return UNKNOWN;
        }
}